

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O0

void uv::TCPClient::AfterSend(uv_write_t *req,int status)

{
  TCPClient *this;
  FILE *__stream;
  size_type sVar1;
  CStringStream *pCVar2;
  ILog4zManager *pIVar3;
  undefined8 uVar4;
  long *in_FS_OFFSET;
  string local_90;
  string local_60;
  undefined1 local_40 [8];
  CStringStream ss;
  TCPClient *theclass;
  int status_local;
  uv_write_t *req_local;
  
  this = (TCPClient *)req->data;
  if (status < 0) {
    sVar1 = std::__cxx11::list<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>::size
                      (&this->writeparam_list_);
    if (sVar1 < 0x15) {
      ss.m_pCur = (char *)req;
      std::__cxx11::list<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>::push_back
                (&this->writeparam_list_,(value_type *)&ss.m_pCur);
    }
    else {
      FreeWriteParam((write_param *)req);
    }
    zsummer::log4z::CStringStream::CStringStream
              ((CStringStream *)local_40,(char *)(*in_FS_OFFSET + -0x800),0x800);
    pCVar2 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_40,"send error:");
    GetUVError_abi_cxx11_(&local_60,status);
    zsummer::log4z::CStringStream::operator<<(pCVar2,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    pCVar2 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_40," ( ");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar2,0x187);
    pIVar3 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar3->_vptr_ILog4zManager[8])(pIVar3,0,3,*in_FS_OFFSET + -0x800);
    __stream = _stderr;
    GetUVError_abi_cxx11_(&local_90,status);
    uVar4 = std::__cxx11::string::c_str();
    fprintf(__stream,"send error %s\n",uVar4);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    send_inl(this,req);
  }
  return;
}

Assistant:

void TCPClient::AfterSend(uv_write_t* req, int status)
{
    TCPClient* theclass = (TCPClient*)req->data;
    if (status < 0) {
        if (theclass->writeparam_list_.size() > MAXLISTSIZE) {
            FreeWriteParam((write_param*)req);
        } else {
            theclass->writeparam_list_.push_back((write_param*)req);
        }
        LOGE("send error:" << GetUVError(status));
        fprintf(stderr, "send error %s\n", GetUVError(status).c_str());
        return;
    }
    theclass->send_inl(req);
}